

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

ly_ctx * ly_ctx_new_yl_common
                   (char *search_dir,char *input,LYD_FORMAT format,
                   _func_lyd_node_ptr_ly_ctx_ptr_char_ptr_LYD_FORMAT_int_varargs *parser_func)

{
  char *__s1;
  int iVar1;
  ly_set_set lVar2;
  lyd_node *node;
  lys_module *module;
  LY_ERR *pLVar3;
  lyd_node *revision;
  lyd_node *plVar4;
  lyd_node *name;
  ulong uVar5;
  lyd_node *node_00;
  undefined1 auStack_48 [8];
  ly_set features;
  
  auStack_48 = (undefined1  [8])0x0;
  features.size = 0;
  features.number = 0;
  lVar2.s = (lys_node **)ly_ctx_new(search_dir);
  plVar4 = (lyd_node *)0x0;
  if (((ly_ctx *)lVar2.s == (ly_ctx *)0x0) ||
     (features.set.s = lVar2.s, node = (*parser_func)((ly_ctx *)lVar2.s,input,format,0,0),
     lVar2 = features.set, node == (lyd_node *)0x0)) {
LAB_0010fc8b:
    node = plVar4;
    ly_ctx_destroy((ly_ctx *)lVar2.s,(_func_void_lys_node_ptr_void_ptr *)0x0);
    lVar2.s = (lys_node **)0x0;
  }
  else {
    plVar4 = node->child;
    if (plVar4 == (lyd_node *)0x0) goto LAB_0010fc9c;
    do {
      if (plVar4->schema->nodetype != LYS_LEAF) {
        ly_set_clean((ly_set *)auStack_48);
        node_00 = plVar4->child;
        if (node_00 == (lyd_node *)0x0) {
          name = (lyd_node *)0x0;
          revision = (lyd_node *)0x0;
        }
        else {
          revision = (lyd_node *)0x0;
          name = (lyd_node *)0x0;
          do {
            __s1 = node_00->schema->name;
            iVar1 = strcmp(__s1,"name");
            if (iVar1 == 0) {
              name = node_00->child;
            }
            else {
              iVar1 = strcmp(__s1,"revision");
              if (iVar1 == 0) {
                revision = node_00->child;
              }
              else {
                iVar1 = strcmp(__s1,"feature");
                if (iVar1 == 0) {
                  ly_set_add((ly_set *)auStack_48,node_00,1);
                }
                else {
                  iVar1 = strcmp(__s1,"conformance-type");
                  if ((iVar1 == 0) && (*(int *)(node_00[1].schema)->padding != 0))
                  goto LAB_0010fc50;
                }
              }
            }
            node_00 = node_00->next;
          } while (node_00 != (lyd_node *)0x0);
        }
        module = ly_ctx_load_module((ly_ctx *)features.set.s,(char *)name,(char *)revision);
        if (module == (lys_module *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINVAL;
          ly_log(LY_LLERR,"Unable to load module specified by yang library data.");
          lVar2 = features.set;
          plVar4 = node;
          goto LAB_0010fc8b;
        }
        if (auStack_48._4_4_ != 0) {
          uVar5 = 0;
          do {
            lys_features_enable(module,*(char **)(*(long *)(features._0_8_ + uVar5 * 8) + 0x30));
            uVar5 = uVar5 + 1;
          } while (uVar5 < (ulong)auStack_48 >> 0x20);
        }
      }
LAB_0010fc50:
      plVar4 = plVar4->next;
      lVar2 = features.set;
    } while (plVar4 != (lyd_node *)0x0);
  }
  if (node == (lyd_node *)0x0) {
    return (ly_ctx *)lVar2.s;
  }
LAB_0010fc9c:
  lyd_free_withsiblings(node);
  return (ly_ctx *)lVar2.s;
}

Assistant:

static struct ly_ctx *
ly_ctx_new_yl_common(const char *search_dir, const char *input, LYD_FORMAT format,
                     struct lyd_node* (*parser_func)(struct ly_ctx*, const char*, LYD_FORMAT, int,...))
{
    unsigned int u;
    struct lyd_node *module, *node;
    const char *name, *revision;
    struct ly_set features = {0, 0, {NULL}};
    const struct lys_module *mod;
    struct lyd_node *yltree = NULL;
    struct ly_ctx *ctx = NULL;

    /* create empty (with internal modules including ietf-yang-library) context */
    ctx = ly_ctx_new(search_dir);
    if (!ctx) {
        goto error;
    }

    /* parse yang library data tree */
    yltree = parser_func(ctx, input, format, LYD_OPT_DATA, NULL);
    if (!yltree) {
        goto error;
    }

    /* process the data tree */
    LY_TREE_FOR(yltree->child, module) {
        if (module->schema->nodetype == LYS_LEAF) {
            /* module-set-id - ignore it */
            continue;
        }

        /* initiate */
        name = NULL;
        revision = NULL;
        ly_set_clean(&features);

        LY_TREE_FOR(module->child, node) {
            if (!strcmp(node->schema->name, "name")) {
                name = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "revision")) {
                revision = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "feature")) {
                ly_set_add(&features, node, LY_SET_OPT_USEASLIST);
            } else if (!strcmp(node->schema->name, "conformance-type") &&
                    ((struct lyd_node_leaf_list*)node)->value.enm->value) {
                /* imported module - skip it, it will be loaded as a side effect
                 * of loading another module */
                goto next_module;
            }
        }

        /* use the gathered data to load the module */
        mod = ly_ctx_load_module(ctx, name, revision);
        if (!mod) {
            LOGERR(LY_EINVAL, "Unable to load module specified by yang library data.");
            goto error;
        }

        /* set features */
        for (u = 0; u < features.number; u++) {
            lys_features_enable(mod, ((struct lyd_node_leaf_list*)features.set.d[u])->value_str);
        }

next_module:;
    }

    if (0) {
        /* skip context destroy in case of success */
error:
        ly_ctx_destroy(ctx, NULL);
        ctx = NULL;
    }

    /* cleanup */
    if (yltree) {
        /* yang library data tree */
        lyd_free_withsiblings(yltree);
    }

    return ctx;
}